

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O2

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::StringBuilder
          (StringBuilder<Memory::ArenaAllocator> *this,ArenaAllocator *alloc,charcount_t initialSize
          )

{
  this->alloc = alloc;
  this->firstChunk = (Data *)0x0;
  this->secondChunk = (Data *)0x0;
  this->appendPtr = (char16 *)0x0;
  this->length = 0;
  this->count = 0;
  this->initialSize = initialSize;
  if (initialSize < 0x7fffffff) {
    return;
  }
  Throw::OutOfMemory();
}

Assistant:

StringBuilder(TAllocator* alloc, charcount_t initialSize) : alloc(alloc), length(0), count(0), firstChunk(NULL),
            secondChunk(NULL), appendPtr(NULL), initialSize(initialSize)
        {
            if (initialSize > MaxLength)
            {
                Throw::OutOfMemory();
            }
        }